

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

int __thiscall HevcUnitWithProfile::profile_tier_level(HevcUnitWithProfile *this,int subLayers)

{
  uchar uVar1;
  bool bVar2;
  BitStreamException *e;
  int i_2;
  int i_1;
  int i;
  byte abStack_2c [8];
  bool sub_layer_level_present_flag [7];
  bool sub_layer_profile_present_flag [7];
  int subLayers_local;
  HevcUnitWithProfile *this_local;
  
  sub_layer_level_present_flag[4] = false;
  sub_layer_level_present_flag[5] = false;
  sub_layer_level_present_flag[6] = false;
  sub_layer_level_present_flag[0] = false;
  sub_layer_level_present_flag[1] = false;
  sub_layer_level_present_flag[2] = false;
  sub_layer_level_present_flag[3] = false;
  abStack_2c[4] = 0;
  abStack_2c[5] = 0;
  abStack_2c[6] = 0;
  abStack_2c[0] = 0;
  abStack_2c[1] = 0;
  abStack_2c[2] = 0;
  abStack_2c[3] = 0;
  BitStreamReader::skipBits(&(this->super_HevcUnit).m_reader,3);
  uVar1 = BitStreamReader::getBits<unsigned_char>(&(this->super_HevcUnit).m_reader,5);
  this->profile_idc = uVar1;
  BitStreamReader::skipBits(&(this->super_HevcUnit).m_reader,0x20);
  BitStreamReader::skipBit(&(this->super_HevcUnit).m_reader);
  bVar2 = BitStreamReader::getBit(&(this->super_HevcUnit).m_reader);
  this->interlaced_source_flag = bVar2;
  BitStreamReader::skipBits(&(this->super_HevcUnit).m_reader,0x20);
  BitStreamReader::skipBits(&(this->super_HevcUnit).m_reader,0xe);
  uVar1 = BitStreamReader::getBits<unsigned_char>(&(this->super_HevcUnit).m_reader,8);
  this->level_idc = uVar1;
  for (i_2 = 0; i_2 < subLayers + -1; i_2 = i_2 + 1) {
    bVar2 = BitStreamReader::getBit(&(this->super_HevcUnit).m_reader);
    sub_layer_level_present_flag[i_2] = bVar2;
    bVar2 = BitStreamReader::getBit(&(this->super_HevcUnit).m_reader);
    abStack_2c[i_2] = bVar2;
  }
  if (1 < subLayers) {
    for (e._4_4_ = subLayers + -1; e._4_4_ < 8; e._4_4_ = e._4_4_ + 1) {
      BitStreamReader::skipBits(&(this->super_HevcUnit).m_reader,2);
    }
  }
  for (e._0_4_ = 0; (int)e < subLayers + -1; e._0_4_ = (int)e + 1) {
    if ((sub_layer_level_present_flag[(int)e] & 1U) != 0) {
      BitStreamReader::skipBits(&(this->super_HevcUnit).m_reader,0x20);
      BitStreamReader::skipBits(&(this->super_HevcUnit).m_reader,0x20);
      BitStreamReader::skipBits(&(this->super_HevcUnit).m_reader,0x18);
    }
    if ((abStack_2c[(int)e] & 1) != 0) {
      BitStreamReader::skipBits(&(this->super_HevcUnit).m_reader,8);
    }
  }
  return 0;
}

Assistant:

int HevcUnitWithProfile::profile_tier_level(const int subLayers)
{
    try
    {
        bool sub_layer_profile_present_flag[7]{false};
        bool sub_layer_level_present_flag[7]{false};

        m_reader.skipBits(3);  // profile_space, tier_flag
        profile_idc = m_reader.getBits<uint8_t>(5);
        m_reader.skipBits(32);  // general_profile_compatibility_flag
        m_reader.skipBit();     // progressive_source_flag
        interlaced_source_flag = m_reader.getBit();
        m_reader.skipBits(32);  // unused flags
        m_reader.skipBits(14);  // unused flags
        level_idc = m_reader.getBits<uint8_t>(8);

        for (int i = 0; i < subLayers - 1; i++)
        {
            sub_layer_profile_present_flag[i] = m_reader.getBit();
            sub_layer_level_present_flag[i] = m_reader.getBit();
        }
        if (subLayers > 1)
        {
            for (int i = subLayers - 1; i < 8; i++) m_reader.skipBits(2);  // reserved_zero_2bits
        }

        for (int i = 0; i < subLayers - 1; i++)
        {
            if (sub_layer_profile_present_flag[i])
            {
                m_reader.skipBits(32);  // unused flags
                m_reader.skipBits(32);  // unused flags
                m_reader.skipBits(24);  // unused flags
            }
            if (sub_layer_level_present_flag[i])
                m_reader.skipBits(8);  // sub_layer_level_idc[ i ]
        }
        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}